

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9e8bb::TransformSelectorRegex::~TransformSelectorRegex
          (TransformSelectorRegex *this)

{
  (this->super_TransformSelector).super_TransformSelector._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorRegex_00927fe8;
  cmsys::RegularExpression::~RegularExpression(&this->Regex);
  TransformSelector::~TransformSelector(&this->super_TransformSelector);
  return;
}

Assistant:

TransformSelectorRegex(const std::string& regex)
    : TransformSelector("REGEX")
    , Regex(regex)
  {
  }